

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> * __thiscall
VectorInstance::op_sliceFromIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  iterator __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *in_RDI;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *this_00;
  int index;
  difference_type in_stack_ffffffffffffff10;
  int iVar4;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *this_01;
  allocator_type *in_stack_ffffffffffffff38;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff58;
  IntegerInstance *in_stack_ffffffffffffff60;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffffa8;
  
  this_01 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar1 = IntegerInstance::value((IntegerInstance *)&stack0xffffffffffffff80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bfee9);
  if (-1 < iVar1) {
    iVar4 = iVar1;
    sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78));
    if (iVar1 <= (int)sVar2) {
      this_00 = (vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                (in_RSI + 0x78);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                (this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator+((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                   *)CONCAT44(iVar4,iVar1),in_stack_ffffffffffffff10);
      __first = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                ::end(this_00);
      std::allocator<std::shared_ptr<Instance>_>::allocator
                ((allocator<std::shared_ptr<Instance>_> *)0x1bff94);
      std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>::
      vector<__gnu_cxx::__normal_iterator<std::shared_ptr<Instance>*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>,void>
                (in_stack_ffffffffffffff40,
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  )__first._M_current,in_stack_ffffffffffffff48,in_stack_ffffffffffffff38);
      vector_representation_abi_cxx11_(in_stack_ffffffffffffffa8);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::~vector
                (this_01);
      std::allocator<std::shared_ptr<Instance>_>::~allocator
                ((allocator<std::shared_ptr<Instance>_> *)0x1bffd4);
      return in_RDI;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_sliceFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return vector_representation(std::vector<std::shared_ptr<Instance>>(_value.begin() + index, _value.end()));
}